

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void decode_partition(AV1Decoder *pbi,ThreadData *td,int mi_row,int mi_col,aom_reader *reader,
                     BLOCK_SIZE bsize,int parse_decode_flag)

{
  od_ec_dec *dec;
  byte bVar1;
  uint8_t uVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  aom_cdf_prob aVar6;
  FRAME_CONTEXT *pFVar7;
  MB_MODE_INFO **ppMVar8;
  BLOCK_SIZE BVar9;
  uint16_t uVar10;
  short sVar11;
  int mi_row_00;
  int mi_col_00;
  int iVar12;
  RestorationType RVar13;
  int iVar14;
  uint uVar15;
  byte bVar16;
  byte bVar17;
  WienerInfo *ref_wiener_info;
  ulong uVar18;
  size_t __n;
  char cVar19;
  int bit;
  int iVar20;
  ThreadData *unaff_RBX;
  uint7 uVar22;
  block_visitor_fn_t p_Var21;
  RestorationUnitInfo *pRVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  PARTITION_CONTEXT *__s;
  PARTITION_TYPE PVar29;
  undefined7 in_register_00000089;
  BLOCK_SIZE BVar30;
  int literal;
  int iVar31;
  SgrprojInfo *pSVar32;
  RestorationInfo *pRVar33;
  aom_cdf_prob (*icdf) [11];
  uint uVar34;
  long lVar35;
  bool bVar36;
  int rcol0;
  int rrow1;
  int rcol1;
  int rrow0;
  RestorationInfo *rsi;
  uint local_a8;
  uint local_9c;
  ulong local_98;
  int local_90;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  SgrprojInfo *local_78;
  int local_6c;
  RestorationInfo *local_68;
  RestorationInfo *local_60;
  SgrprojInfo *local_58;
  WienerInfo *local_50;
  AV1Common *local_48;
  long local_40;
  long local_38;
  
  iVar20 = (int)CONCAT71(in_register_00000089,bsize);
  uVar28 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  BVar30 = BLOCK_INVALID;
  switch(uVar28) {
  case 0:
    uVar18 = uVar28;
    break;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
    goto switchD_0016dac7_caseD_1;
  case 3:
    uVar18 = 1;
    break;
  case 6:
    uVar18 = 2;
    break;
  case 9:
    uVar18 = 3;
    break;
  default:
    if (iVar20 == 0xc) {
      uVar18 = 4;
    }
    else {
      if (iVar20 != 0xf) goto switchD_0016dac7_caseD_1;
      uVar18 = 5;
    }
  }
  BVar30 = subsize_lookup[3][uVar18];
switchD_0016dac7_caseD_1:
  iVar20 = (pbi->common).mi_params.mi_rows;
  iVar31 = (pbi->common).mi_params.mi_cols;
  if (iVar31 <= mi_col || iVar20 <= mi_row) {
    return;
  }
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar28];
  uVar25 = (uint)(bVar1 >> 1);
  mi_row_00 = uVar25 + mi_row;
  mi_col_00 = uVar25 + mi_col;
  local_88 = (ulong)bsize;
  if ((parse_decode_flag & 1U) == 0) {
    iVar12 = (pbi->common).mi_params.mi_stride;
    ppMVar8 = (pbi->common).mi_params.mi_grid_base;
    lVar26 = (long)(iVar12 * mi_row + mi_col);
    BVar9 = ppMVar8[lVar26]->bsize;
    if (BVar9 == bsize) {
      uVar18 = 0;
      goto LAB_0016e45b;
    }
    bVar16 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar28];
    bVar17 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar9];
    bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar9];
    if ((BLOCK_8X8 < bsize) && (mi_row_00 < iVar20)) {
      unaff_RBX = (ThreadData *)0x0;
      if ((int)((uint)(bVar16 >> 1) + mi_col) < iVar31) {
        iVar12 = (uint)(bVar16 >> 1) * iVar12;
        uVar22 = (uint7)(uint3)((uint)iVar12 >> 8);
        if (bVar3 == bVar1) {
          uVar18 = CONCAT71(uVar22,8);
          if ((uint)bVar17 << 2 != (uint)bVar16) {
            cVar19 = (ppMVar8[lVar26 + iVar12]->bsize != BVar9) << 2;
            goto LAB_0016e3fc;
          }
        }
        else {
          local_a8 = (uint)bVar1;
          if (bVar17 == bVar16) {
            uVar18 = CONCAT71(uVar22,9);
            if ((uint)bVar3 << 2 != local_a8) {
              uVar18 = (ulong)((uint)(ppMVar8[lVar26 + (ulong)uVar25]->bsize != BVar9) * 5 + 2);
            }
          }
          else {
            uVar18 = CONCAT71(uVar22,3);
            if (((uint)bVar17 * 2 == (uint)bVar16 && (uint)bVar3 * 2 == local_a8) &&
               (uVar18 = CONCAT71(uVar22,4),
               "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
               [ppMVar8[lVar26 + iVar12]->bsize] != bVar1)) {
              uVar18 = (ulong)((uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                      [ppMVar8[lVar26 + (ulong)uVar25]->bsize] == bVar16) * 3 + 3);
            }
          }
        }
        goto LAB_0016e45b;
      }
    }
    uVar18 = CONCAT71((int7)((ulong)unaff_RBX >> 8),
                      *(undefined1 *)
                       ((long)&get_partition_base_partitions +
                       (ulong)(bVar17 < bVar16) + (ulong)(bVar3 < bVar1) * 2));
LAB_0016e378:
    if ((char)uVar18 != -1) goto LAB_0016e45b;
    uVar18 = CONCAT71((int7)(uVar18 >> 8),0xff);
LAB_0016e4dc:
    (td->dcb).xd.mi_row = mi_row;
    aom_internal_error((td->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,
                       "Partition is invalid for block size %dx%d",(ulong)block_size_wide[uVar28],
                       (ulong)block_size_high[uVar28]);
    BVar9 = BLOCK_INVALID;
  }
  else {
    local_48 = &pbi->common;
    uVar2 = ((pbi->common).seq_params)->monochrome;
    local_68 = (pbi->common).rst_info;
    local_50 = (td->dcb).xd.wiener_info;
    local_58 = (td->dcb).xd.sgrproj_info;
    dec = &reader->ec;
    uVar18 = 0;
    do {
      local_80 = uVar18;
      if (((local_68[uVar18].frame_restoration_type != RESTORE_NONE) &&
          (iVar12 = av1_loop_restoration_corners_in_sb
                              (local_48,(int)uVar18,mi_row,mi_col,(BLOCK_SIZE)local_88,
                               (int *)&local_9c,(int *)&local_8c,&local_6c,&local_90), iVar12 != 0))
         && (lVar26 = (long)local_6c, local_6c < local_90)) {
        pRVar33 = local_68 + uVar18;
        local_40 = (long)pRVar33->horz_units;
        local_98 = CONCAT44(local_98._4_4_,(uint)(local_80 == 0) * 2 + 5);
        ref_wiener_info = local_50 + local_80;
        local_78 = local_58 + local_80;
        uVar18 = (ulong)local_8c;
        iVar12 = local_90;
        local_60 = pRVar33;
        do {
          lVar35 = (long)(int)local_9c;
          if ((int)local_9c < (int)uVar18) {
            lVar27 = lVar26 * local_40;
            local_38 = lVar26;
            do {
              pRVar23 = pRVar33->unit_info + lVar35 + lVar27;
              RVar13 = pRVar33->frame_restoration_type;
              if (RVar13 == RESTORE_WIENER) {
                unaff_RBX = (ThreadData *)(td->dcb).xd.tile_ctx;
                iVar12 = od_ec_decode_cdf_q15(dec,(unaff_RBX->dcb).xd.cfl.recon_buf_q3 + 0x3c9,2);
                if (reader->allow_update_cdf != '\0') {
                  uVar4 = (unaff_RBX->dcb).xd.cfl.recon_buf_q3[0x3cb];
                  bVar16 = (char)(uVar4 >> 4) + 4;
                  uVar5 = (unaff_RBX->dcb).xd.cfl.recon_buf_q3[0x3c9];
                  if ((char)iVar12 < '\x01') {
                    sVar11 = -(uVar5 >> (bVar16 & 0x1f));
                  }
                  else {
                    sVar11 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
                  }
                  (unaff_RBX->dcb).xd.cfl.recon_buf_q3[0x3c9] = sVar11 + uVar5;
                  (unaff_RBX->dcb).xd.cfl.recon_buf_q3[0x3cb] = uVar4 + (uVar4 < 0x20);
                }
                if (iVar12 == 0) {
LAB_0016e038:
                  pRVar23->restoration_type = RESTORE_NONE;
                }
                else {
                  pRVar23->restoration_type = RESTORE_WIENER;
                  read_wiener_filter((int)local_98,&pRVar23->wiener_info,ref_wiener_info,reader);
                }
              }
              else if (RVar13 == RESTORE_SGRPROJ) {
                unaff_RBX = (ThreadData *)(td->dcb).xd.tile_ctx;
                iVar12 = od_ec_decode_cdf_q15(dec,(unaff_RBX->dcb).xd.cfl.recon_buf_q3 + 0x3cc,2);
                if (reader->allow_update_cdf != '\0') {
                  uVar4 = (unaff_RBX->dcb).xd.cfl.recon_buf_q3[0x3ce];
                  bVar16 = (char)(uVar4 >> 4) + 4;
                  uVar5 = (unaff_RBX->dcb).xd.cfl.recon_buf_q3[0x3cc];
                  if ((char)iVar12 < '\x01') {
                    sVar11 = -(uVar5 >> (bVar16 & 0x1f));
                  }
                  else {
                    sVar11 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
                  }
                  (unaff_RBX->dcb).xd.cfl.recon_buf_q3[0x3cc] = sVar11 + uVar5;
                  (unaff_RBX->dcb).xd.cfl.recon_buf_q3[0x3ce] = uVar4 + (uVar4 < 0x20);
                }
                if (iVar12 == 0) goto LAB_0016e038;
                pRVar23->restoration_type = RESTORE_SGRPROJ;
                uVar25 = 0;
                iVar12 = 3;
                do {
                  iVar14 = od_ec_decode_bool_q15(dec,0x4000);
                  uVar25 = uVar25 | iVar14 << ((byte)iVar12 & 0x1f);
                  bVar36 = iVar12 != 0;
                  iVar12 = iVar12 + -1;
                } while (bVar36);
                (pRVar23->sgrproj_info).ep = uVar25;
                unaff_RBX = (ThreadData *)((long)(int)uVar25 * 0x10);
                if (unaff_RBX[0x15].cb_buffer_base.dqcoeff[2][0x20d0] == 0) {
                  (pRVar23->sgrproj_info).xqd[0] = 0;
LAB_0016e06a:
                  pSVar32 = local_78;
                  uVar10 = aom_read_primitive_refsubexpfin_
                                     (reader,0x80,4,(short)local_78->xqd[1] + 0x20);
                  iVar12 = uVar10 - 0x20;
                }
                else {
LAB_0016df82:
                  pSVar32 = local_78;
                  uVar10 = aom_read_primitive_refsubexpfin_
                                     (reader,0x80,4,(short)local_78->xqd[0] + 0x60);
                  iVar12 = unaff_RBX[0x15].cb_buffer_base.dqcoeff[2][0x20d1];
                  (pRVar23->sgrproj_info).xqd[0] = uVar10 - 0x60;
                  unaff_RBX = td;
                  if (iVar12 == 0) {
                    iVar12 = 0xe0 - (uint)uVar10;
                    if (0x5e < iVar12) {
                      iVar12 = 0x5f;
                    }
                    if (iVar12 < -0x1f) {
                      iVar12 = -0x20;
                    }
                  }
                  else {
                    uVar10 = aom_read_primitive_refsubexpfin_
                                       (reader,0x80,4,(short)pSVar32->xqd[1] + 0x20);
                    iVar12 = uVar10 - 0x20;
                  }
                }
                (pRVar23->sgrproj_info).xqd[1] = iVar12;
                pSVar32->xqd[1] = (pRVar23->sgrproj_info).xqd[1];
                iVar12 = (pRVar23->sgrproj_info).xqd[0];
                pSVar32->ep = (pRVar23->sgrproj_info).ep;
                pSVar32->xqd[0] = iVar12;
                pRVar33 = local_60;
              }
              else if (RVar13 == RESTORE_SWITCHABLE) {
                pFVar7 = (td->dcb).xd.tile_ctx;
                unaff_RBX = (ThreadData *)pFVar7->switchable_restore_cdf;
                RVar13 = od_ec_decode_cdf_q15(dec,(uint16_t *)unaff_RBX,3);
                if (reader->allow_update_cdf != '\0') {
                  uVar4 = pFVar7->switchable_restore_cdf[3];
                  bVar16 = (char)(uVar4 >> 4) + 4;
                  lVar26 = 0;
                  do {
                    uVar5 = *(aom_cdf_prob *)((long)unaff_RBX + lVar26 * 2);
                    if (lVar26 < (char)RVar13) {
                      sVar11 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
                    }
                    else {
                      sVar11 = -(uVar5 >> (bVar16 & 0x1f));
                    }
                    *(ushort *)((long)unaff_RBX + lVar26 * 2) = sVar11 + uVar5;
                    lVar26 = lVar26 + 1;
                  } while (lVar26 != 2);
                  pFVar7->switchable_restore_cdf[3] =
                       pFVar7->switchable_restore_cdf[3] + (ushort)(uVar4 < 0x20);
                }
                pRVar23->restoration_type = RVar13;
                if (RVar13 == RESTORE_WIENER) {
                  read_wiener_filter((int)local_98,&pRVar23->wiener_info,ref_wiener_info,reader);
                }
                else if (RVar13 == RESTORE_SGRPROJ) {
                  uVar25 = 0;
                  iVar12 = 3;
                  do {
                    iVar14 = od_ec_decode_bool_q15(dec,0x4000);
                    uVar25 = uVar25 | iVar14 << ((byte)iVar12 & 0x1f);
                    bVar36 = iVar12 != 0;
                    iVar12 = iVar12 + -1;
                  } while (bVar36);
                  (pRVar23->sgrproj_info).ep = uVar25;
                  unaff_RBX = (ThreadData *)((long)(int)uVar25 * 0x10);
                  if (unaff_RBX[0x15].cb_buffer_base.dqcoeff[2][0x20d0] == 0) {
                    (pRVar23->sgrproj_info).xqd[0] = 0;
                    goto LAB_0016e06a;
                  }
                  goto LAB_0016df82;
                }
              }
              lVar35 = lVar35 + 1;
              uVar18 = (ulong)(int)local_8c;
              lVar26 = local_38;
              iVar12 = local_90;
            } while (lVar35 < (long)uVar18);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 < iVar12);
      }
    } while ((uVar2 == '\0') && (uVar18 = local_80 + 1, local_80 < 2));
    if (bsize < BLOCK_8X8) {
      uVar18 = 0;
    }
    else {
      uVar18 = CONCAT71((int7)((ulong)unaff_RBX >> 8),3);
      if (mi_row_00 < iVar20 || mi_col_00 < iVar31) {
        bVar16 = ""[uVar28];
        lVar26 = (ulong)bVar16 - 1;
        bVar36 = ((uint)(int)(td->dcb).xd.above_partition_context[mi_col] >> ((uint)lVar26 & 0x1f) &
                 1) != 0;
        uVar25 = ((uint)(int)(td->dcb).xd.left_partition_context[mi_row & 0x1f] >>
                 ((byte)lVar26 & 0x1f)) * 2 & 2;
        lVar26 = (ulong)(bVar36 + uVar25) + (ulong)bVar16 * 4;
        pFVar7 = (td->dcb).xd.tile_ctx;
        icdf = pFVar7->partition_cdf + lVar26 + -4;
        if (mi_row_00 < iVar20 && mi_col_00 < iVar31) {
          uVar34 = 4;
          if (bsize != BLOCK_8X8) {
            uVar34 = (bsize != BLOCK_128X128) + 8 + (uint)(bsize != BLOCK_128X128);
          }
          uVar15 = od_ec_decode_cdf_q15(dec,*icdf,uVar34);
          uVar18 = (ulong)uVar15;
          if (reader->allow_update_cdf != '\0') {
            uVar4 = (*icdf)[uVar34];
            bVar17 = (char)(uVar4 >> 4) + 5;
            iVar12 = uVar25 + (uint)bVar16 * 4 + (uint)bVar36 + -4;
            uVar24 = 0;
            do {
              uVar5 = pFVar7->partition_cdf[iVar12][uVar24];
              if ((long)uVar24 < (long)(char)uVar15) {
                sVar11 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar17 & 0x1f));
              }
              else {
                sVar11 = -(uVar5 >> (bVar17 & 0x1f));
              }
              pFVar7->partition_cdf[iVar12][uVar24] = sVar11 + uVar5;
              uVar24 = uVar24 + 1;
            } while (uVar34 - 1 != uVar24);
            (*icdf)[uVar34] = (*icdf)[uVar34] + (ushort)(uVar4 < 0x20);
          }
          goto LAB_0016e378;
        }
        uVar22 = 0;
        if (mi_row_00 < iVar20 || iVar31 <= mi_col_00) {
          sVar11 = ((pFVar7->partition_cdf[lVar26 + -4][1] - (*icdf)[0] ^ 0x8000) -
                   pFVar7->partition_cdf[lVar26 + -4][2]) + pFVar7->partition_cdf[lVar26 + -4][6];
          if (bsize != BLOCK_128X128) {
            sVar11 = (sVar11 - pFVar7->partition_cdf[lVar26 + -4][7]) +
                     pFVar7->partition_cdf[lVar26 + -4][8];
          }
          local_9c = (uint)(ushort)(0x8000 - sVar11);
          iVar12 = od_ec_decode_cdf_q15(dec,(uint16_t *)&local_9c,2);
          uVar18 = (ulong)(iVar12 == 0) ^ 3;
        }
        else {
          aVar6 = pFVar7->partition_cdf[lVar26 + -4][2];
          sVar11 = (((aVar6 - pFVar7->partition_cdf[lVar26 + -4][1]) +
                    pFVar7->partition_cdf[lVar26 + -4][4]) -
                   (aVar6 + pFVar7->partition_cdf[lVar26 + -4][5])) +
                   pFVar7->partition_cdf[lVar26 + -4][7] + -0x8000;
          if (bsize != BLOCK_128X128) {
            sVar11 = (sVar11 - pFVar7->partition_cdf[lVar26 + -4][8]) +
                     pFVar7->partition_cdf[lVar26 + -4][9];
          }
          local_9c = (uint)(ushort)(0x8000 - sVar11);
          iVar12 = od_ec_decode_cdf_q15(dec,(uint16_t *)&local_9c,2);
          cVar19 = (iVar12 != 0) * '\x02';
LAB_0016e3fc:
          uVar18 = CONCAT71(uVar22,cVar19 + '\x01');
        }
      }
    }
LAB_0016e45b:
    if (bsize < BLOCK_32X64) {
      (*(code *)(&DAT_004ca058 + *(int *)(&DAT_004ca058 + local_88 * 4)))();
      return;
    }
    if ((int)local_88 == 0xc) {
      lVar26 = 4;
    }
    else {
      if ((int)local_88 != 0xf) goto LAB_0016e4dc;
      lVar26 = 5;
    }
    BVar9 = subsize_lookup[uVar18 & 0xff][lVar26];
    if (BVar9 == BLOCK_INVALID) goto LAB_0016e4dc;
  }
  if (av1_ss_size_lookup[BVar9][(td->dcb).xd.plane[1].subsampling_x]
      [(td->dcb).xd.plane[1].subsampling_y] == BLOCK_INVALID) {
    (td->dcb).xd.mi_row = mi_row;
    aom_internal_error((td->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,
                       "Block size %dx%d invalid with this subsampling mode",
                       (ulong)block_size_wide[BVar9],(ulong)block_size_high[BVar9]);
  }
  local_98 = uVar18;
  if (9 < (byte)uVar18) goto LAB_0016ea00;
  switch(uVar18 & 0xff) {
  case 0:
    (*decode_partition::block_visit[(uint)parse_decode_flag])
              (pbi,td,mi_row,mi_col,reader,'\0',BVar9);
    break;
  case 1:
    p_Var21 = decode_partition::block_visit[(uint)parse_decode_flag];
    (*p_Var21)(pbi,td,mi_row,mi_col,reader,'\x01',BVar9);
    if (mi_row_00 < iVar20) {
      PVar29 = '\x01';
      mi_col_00 = mi_col;
LAB_0016e8de:
      (*p_Var21)(pbi,td,mi_row_00,mi_col_00,reader,PVar29,BVar9);
    }
    break;
  case 2:
    p_Var21 = decode_partition::block_visit[(uint)parse_decode_flag];
    (*p_Var21)(pbi,td,mi_row,mi_col,reader,'\x02',BVar9);
    if (mi_col_00 < iVar31) {
      PVar29 = '\x02';
      mi_row_00 = mi_row;
      goto LAB_0016e8de;
    }
    break;
  case 3:
    decode_partition(pbi,td,mi_row,mi_col,reader,BVar9,parse_decode_flag);
    decode_partition(pbi,td,mi_row,mi_col_00,reader,BVar9,parse_decode_flag);
    decode_partition(pbi,td,mi_row_00,mi_col,reader,BVar9,parse_decode_flag);
    decode_partition(pbi,td,mi_row_00,mi_col_00,reader,BVar9,parse_decode_flag);
    break;
  case 4:
    p_Var21 = decode_partition::block_visit[(uint)parse_decode_flag];
    (*p_Var21)(pbi,td,mi_row,mi_col,reader,'\x04',BVar30);
    (*p_Var21)(pbi,td,mi_row,mi_col_00,reader,'\x04',BVar30);
    PVar29 = '\x04';
    BVar30 = BVar9;
    mi_col_00 = mi_col;
    goto LAB_0016e9fe;
  case 5:
    p_Var21 = decode_partition::block_visit[(uint)parse_decode_flag];
    (*p_Var21)(pbi,td,mi_row,mi_col,reader,'\x05',BVar9);
    (*p_Var21)(pbi,td,mi_row_00,mi_col,reader,'\x05',BVar30);
    (*p_Var21)(pbi,td,mi_row_00,mi_col_00,reader,'\x05',BVar30);
    break;
  case 6:
    p_Var21 = decode_partition::block_visit[(uint)parse_decode_flag];
    (*p_Var21)(pbi,td,mi_row,mi_col,reader,'\x06',BVar30);
    (*p_Var21)(pbi,td,mi_row_00,mi_col,reader,'\x06',BVar30);
    PVar29 = '\x06';
    mi_row_00 = mi_row;
    BVar30 = BVar9;
    goto LAB_0016e9fe;
  case 7:
    p_Var21 = decode_partition::block_visit[(uint)parse_decode_flag];
    (*p_Var21)(pbi,td,mi_row,mi_col,reader,'\a',BVar9);
    (*p_Var21)(pbi,td,mi_row,mi_col_00,reader,'\a',BVar30);
    PVar29 = '\a';
LAB_0016e9fe:
    (*p_Var21)(pbi,td,mi_row_00,mi_col_00,reader,PVar29,BVar30);
    break;
  case 8:
    iVar31 = 4;
    iVar20 = mi_row;
    do {
      if ((iVar31 != 4) && ((pbi->common).mi_params.mi_rows <= iVar20)) break;
      (*decode_partition::block_visit[(uint)parse_decode_flag])
                (pbi,td,iVar20,mi_col,reader,'\b',BVar9);
      iVar20 = iVar20 + (uint)(bVar1 >> 2);
      iVar31 = iVar31 + -1;
    } while (iVar31 != 0);
    break;
  case 9:
    iVar31 = 4;
    iVar20 = mi_col;
    do {
      if ((iVar31 != 4) && ((pbi->common).mi_params.mi_cols <= iVar20)) break;
      (*decode_partition::block_visit[(uint)parse_decode_flag])
                (pbi,td,mi_row,iVar20,reader,'\t',BVar9);
      iVar20 = iVar20 + (uint)(bVar1 >> 2);
      iVar31 = iVar31 + -1;
    } while (iVar31 != 0);
  }
LAB_0016ea00:
  if (bsize < BLOCK_8X8 || (parse_decode_flag & 1U) == 0) {
    return;
  }
  uVar24 = 0xff;
  switch((int)local_88) {
  case 6:
    lVar26 = 2;
    break;
  case 7:
  case 8:
  case 10:
  case 0xb:
  case 0xd:
  case 0xe:
    goto switchD_0016ea59_caseD_7;
  case 9:
    lVar26 = 3;
    break;
  case 0xc:
    lVar26 = 4;
    break;
  case 0xf:
    lVar26 = 5;
    break;
  default:
    lVar26 = 1;
    if ((int)local_88 == 3) break;
    goto switchD_0016ea59_caseD_7;
  }
  uVar24 = (ulong)subsize_lookup[3][lVar26];
switchD_0016ea59_caseD_7:
  if (9 < (byte)local_98) {
    return;
  }
  uVar25 = (uint)(bVar1 >> 1);
  switch(uVar18 & 0xff) {
  case 3:
    if (bsize != BLOCK_8X8) {
      return;
    }
  default:
    __s = (td->dcb).xd.left_partition_context + (mi_row & 0x1f);
    __n = (size_t)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [uVar28];
    memset((td->dcb).xd.above_partition_context + mi_col,
           (uint)(byte)partition_context_lookup[BVar9].above,(ulong)bVar1);
    uVar34 = (uint)(byte)partition_context_lookup[BVar9].left;
    break;
  case 4:
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar9];
    __n = (size_t)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [BVar9];
    memset((td->dcb).xd.above_partition_context + mi_col,
           (uint)(byte)partition_context_lookup[uVar24].above,(ulong)bVar1);
    memset((td->dcb).xd.left_partition_context + (mi_row & 0x1f),
           (uint)(byte)partition_context_lookup[uVar24].left,__n);
    memset((td->dcb).xd.above_partition_context + mi_col,
           (uint)(byte)partition_context_lookup[BVar9].above,(ulong)bVar1);
    bVar1 = partition_context_lookup[BVar9].left;
    goto LAB_0016ed79;
  case 5:
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar9];
    __n = (size_t)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [BVar9];
    memset((td->dcb).xd.above_partition_context + mi_col,
           (uint)(byte)partition_context_lookup[BVar9].above,(ulong)bVar1);
    memset((td->dcb).xd.left_partition_context + (mi_row & 0x1f),
           (uint)(byte)partition_context_lookup[BVar9].left,__n);
    memset((td->dcb).xd.above_partition_context + mi_col,
           (uint)(byte)partition_context_lookup[uVar24].above,(ulong)bVar1);
    bVar1 = partition_context_lookup[uVar24].left;
LAB_0016ed79:
    uVar34 = (uint)bVar1;
    __s = (td->dcb).xd.left_partition_context + (uVar25 + mi_row & 0x1f);
    break;
  case 6:
    __s = (td->dcb).xd.left_partition_context + (mi_row & 0x1f);
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar9];
    __n = (size_t)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [BVar9];
    memset((td->dcb).xd.above_partition_context + mi_col,
           (uint)(byte)partition_context_lookup[uVar24].above,(ulong)bVar1);
    memset(__s,(uint)(byte)partition_context_lookup[uVar24].left,__n);
    memset((td->dcb).xd.above_partition_context + (int)(uVar25 + mi_col),
           (uint)(byte)partition_context_lookup[BVar9].above,(ulong)bVar1);
    uVar34 = (uint)(byte)partition_context_lookup[BVar9].left;
    break;
  case 7:
    __s = (td->dcb).xd.left_partition_context + (mi_row & 0x1f);
    bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar9];
    __n = (size_t)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [BVar9];
    memset((td->dcb).xd.above_partition_context + mi_col,
           (uint)(byte)partition_context_lookup[BVar9].above,(ulong)bVar1);
    memset(__s,(uint)(byte)partition_context_lookup[BVar9].left,__n);
    memset((td->dcb).xd.above_partition_context + (int)(uVar25 + mi_col),
           (uint)(byte)partition_context_lookup[uVar24].above,(ulong)bVar1);
    uVar34 = (uint)(byte)partition_context_lookup[uVar24].left;
  }
  memset(__s,uVar34,__n);
  return;
}

Assistant:

static inline void decode_partition(AV1Decoder *const pbi, ThreadData *const td,
                                    int mi_row, int mi_col, aom_reader *reader,
                                    BLOCK_SIZE bsize, int parse_decode_flag) {
  assert(bsize < BLOCK_SIZES_ALL);
  AV1_COMMON *const cm = &pbi->common;
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  const int bw = mi_size_wide[bsize];
  const int hbs = bw >> 1;
  PARTITION_TYPE partition;
  BLOCK_SIZE subsize;
  const int quarter_step = bw / 4;
  BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
  const int has_rows = (mi_row + hbs) < cm->mi_params.mi_rows;
  const int has_cols = (mi_col + hbs) < cm->mi_params.mi_cols;

  if (mi_row >= cm->mi_params.mi_rows || mi_col >= cm->mi_params.mi_cols)
    return;

  // parse_decode_flag takes the following values :
  // 01 - do parse only
  // 10 - do decode only
  // 11 - do parse and decode
  static const block_visitor_fn_t block_visit[4] = { NULL, parse_decode_block,
                                                     decode_block,
                                                     parse_decode_block };

  if (parse_decode_flag & 1) {
    const int num_planes = av1_num_planes(cm);
    for (int plane = 0; plane < num_planes; ++plane) {
      int rcol0, rcol1, rrow0, rrow1;

      // Skip some unnecessary work if loop restoration is disabled
      if (cm->rst_info[plane].frame_restoration_type == RESTORE_NONE) continue;

      if (av1_loop_restoration_corners_in_sb(cm, plane, mi_row, mi_col, bsize,
                                             &rcol0, &rcol1, &rrow0, &rrow1)) {
        const int rstride = cm->rst_info[plane].horz_units;
        for (int rrow = rrow0; rrow < rrow1; ++rrow) {
          for (int rcol = rcol0; rcol < rcol1; ++rcol) {
            const int runit_idx = rcol + rrow * rstride;
            loop_restoration_read_sb_coeffs(cm, xd, reader, plane, runit_idx);
          }
        }
      }
    }

    partition = (bsize < BLOCK_8X8) ? PARTITION_NONE
                                    : read_partition(xd, mi_row, mi_col, reader,
                                                     has_rows, has_cols, bsize);
  } else {
    partition = get_partition(cm, mi_row, mi_col, bsize);
  }
  subsize = get_partition_subsize(bsize, partition);
  if (subsize == BLOCK_INVALID) {
    // When an internal error occurs ensure that xd->mi_row is set appropriately
    // w.r.t. current tile, which is used to signal processing of current row is
    // done.
    xd->mi_row = mi_row;
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Partition is invalid for block size %dx%d",
                       block_size_wide[bsize], block_size_high[bsize]);
  }
  // Check the bitstream is conformant: if there is subsampling on the
  // chroma planes, subsize must subsample to a valid block size.
  const struct macroblockd_plane *const pd_u = &xd->plane[1];
  if (get_plane_block_size(subsize, pd_u->subsampling_x, pd_u->subsampling_y) ==
      BLOCK_INVALID) {
    // When an internal error occurs ensure that xd->mi_row is set appropriately
    // w.r.t. current tile, which is used to signal processing of current row is
    // done.
    xd->mi_row = mi_row;
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Block size %dx%d invalid with this subsampling mode",
                       block_size_wide[subsize], block_size_high[subsize]);
  }

#define DEC_BLOCK_STX_ARG
#define DEC_BLOCK_EPT_ARG partition,
#define DEC_BLOCK(db_r, db_c, db_subsize)                                  \
  block_visit[parse_decode_flag](pbi, td, DEC_BLOCK_STX_ARG(db_r), (db_c), \
                                 reader, DEC_BLOCK_EPT_ARG(db_subsize))
#define DEC_PARTITION(db_r, db_c, db_subsize)                        \
  decode_partition(pbi, td, DEC_BLOCK_STX_ARG(db_r), (db_c), reader, \
                   (db_subsize), parse_decode_flag)

  switch (partition) {
    case PARTITION_NONE: DEC_BLOCK(mi_row, mi_col, subsize); break;
    case PARTITION_HORZ:
      DEC_BLOCK(mi_row, mi_col, subsize);
      if (has_rows) DEC_BLOCK(mi_row + hbs, mi_col, subsize);
      break;
    case PARTITION_VERT:
      DEC_BLOCK(mi_row, mi_col, subsize);
      if (has_cols) DEC_BLOCK(mi_row, mi_col + hbs, subsize);
      break;
    case PARTITION_SPLIT:
      DEC_PARTITION(mi_row, mi_col, subsize);
      DEC_PARTITION(mi_row, mi_col + hbs, subsize);
      DEC_PARTITION(mi_row + hbs, mi_col, subsize);
      DEC_PARTITION(mi_row + hbs, mi_col + hbs, subsize);
      break;
    case PARTITION_HORZ_A:
      DEC_BLOCK(mi_row, mi_col, bsize2);
      DEC_BLOCK(mi_row, mi_col + hbs, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col, subsize);
      break;
    case PARTITION_HORZ_B:
      DEC_BLOCK(mi_row, mi_col, subsize);
      DEC_BLOCK(mi_row + hbs, mi_col, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col + hbs, bsize2);
      break;
    case PARTITION_VERT_A:
      DEC_BLOCK(mi_row, mi_col, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col, bsize2);
      DEC_BLOCK(mi_row, mi_col + hbs, subsize);
      break;
    case PARTITION_VERT_B:
      DEC_BLOCK(mi_row, mi_col, subsize);
      DEC_BLOCK(mi_row, mi_col + hbs, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col + hbs, bsize2);
      break;
    case PARTITION_HORZ_4:
      for (int i = 0; i < 4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= cm->mi_params.mi_rows) break;
        DEC_BLOCK(this_mi_row, mi_col, subsize);
      }
      break;
    case PARTITION_VERT_4:
      for (int i = 0; i < 4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= cm->mi_params.mi_cols) break;
        DEC_BLOCK(mi_row, this_mi_col, subsize);
      }
      break;
    default: assert(0 && "Invalid partition type");
  }

#undef DEC_PARTITION
#undef DEC_BLOCK
#undef DEC_BLOCK_EPT_ARG
#undef DEC_BLOCK_STX_ARG

  if (parse_decode_flag & 1)
    update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}